

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O2

void duckdb::Node4::InsertChild(ART *art,Node *node,uint8_t byte,Node child)

{
  BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *n;
  Node node4;
  
  n = &Node::Ref<duckdb::Node4>(art,(Node)(node->super_IndexPointer).data,NODE_4)->
       super_BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3>;
  if (n->count == '\x04') {
    node4 = (Node)(node->super_IndexPointer).data;
    Node16::GrowNode4(art,node,&node4);
    Node16::InsertChild(art,node,byte,child);
    return;
  }
  BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::InsertChildInternal(n,byte,child);
  return;
}

Assistant:

void Node4::InsertChild(ART &art, Node &node, const uint8_t byte, const Node child) {
	// The node is full. Grow to Node16.
	auto &n = Node::Ref<Node4>(art, node, NODE_4);
	if (n.count == CAPACITY) {
		auto node4 = node;
		Node16::GrowNode4(art, node, node4);
		Node16::InsertChild(art, node, byte, child);
		return;
	}

	InsertChildInternal(n, byte, child);
}